

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImVector<ImDrawCmd>::push_front(ImVector<ImDrawCmd> *this,ImDrawCmd *v)

{
  ImTextureID pvVar1;
  ImDrawCallback p_Var2;
  undefined4 uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  ImDrawCmd *pIVar10;
  long lVar11;
  int iVar12;
  
  uVar9 = this->Size;
  if (uVar9 == 0) {
    if (this->Capacity == 0) {
      pIVar10 = (ImDrawCmd *)ImGui::MemAlloc(0x1c0);
      if (this->Data != (ImDrawCmd *)0x0) {
        memcpy(pIVar10,this->Data,(long)this->Size * 0x38);
        ImGui::MemFree(this->Data);
      }
      this->Data = pIVar10;
      this->Capacity = 8;
      lVar11 = (long)this->Size;
    }
    else {
      pIVar10 = this->Data;
      lVar11 = 0;
    }
    pIVar10 = pIVar10 + lVar11;
  }
  else {
    if (uVar9 == this->Capacity) {
      iVar12 = (int)uVar9 / 2 + uVar9;
      if (iVar12 <= (int)(uVar9 + 1)) {
        iVar12 = uVar9 + 1;
      }
      pIVar10 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar12 * 0x38);
      if (this->Data != (ImDrawCmd *)0x0) {
        memcpy(pIVar10,this->Data,(long)this->Size * 0x38);
        ImGui::MemFree(this->Data);
      }
      this->Data = pIVar10;
      this->Capacity = iVar12;
      uVar9 = this->Size;
    }
    else {
      pIVar10 = this->Data;
    }
    if (0 < (int)uVar9) {
      memmove(pIVar10 + 1,pIVar10,(ulong)uVar9 * 0x38);
      pIVar10 = this->Data;
    }
  }
  pIVar10->UserCallbackData = v->UserCallbackData;
  fVar5 = (v->ClipRect).x;
  fVar6 = (v->ClipRect).y;
  fVar7 = (v->ClipRect).z;
  fVar8 = (v->ClipRect).w;
  pvVar1 = v->TextureId;
  uVar9 = v->VtxOffset;
  uVar4 = v->IdxOffset;
  uVar3 = *(undefined4 *)&v->field_0x24;
  p_Var2 = v->UserCallback;
  pIVar10->ElemCount = v->ElemCount;
  *(undefined4 *)&pIVar10->field_0x24 = uVar3;
  pIVar10->UserCallback = p_Var2;
  pIVar10->TextureId = pvVar1;
  pIVar10->VtxOffset = uVar9;
  pIVar10->IdxOffset = uVar4;
  (pIVar10->ClipRect).x = fVar5;
  (pIVar10->ClipRect).y = fVar6;
  (pIVar10->ClipRect).z = fVar7;
  (pIVar10->ClipRect).w = fVar8;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }